

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
::get_content(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
             Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_false>_>_>
             *this,int columnLength)

{
  uint uVar1;
  pointer puVar2;
  uint in_EAX;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  if (columnLength < 0) {
    if ((this->column_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    lVar3 = std::_Rb_tree_decrement(&(this->column_)._M_t._M_impl.super__Rb_tree_header._M_header);
    columnLength = *(int *)(*(long *)(lVar3 + 0x20) + 8) + 1;
  }
  uStack_28 = (ulong)(uint)uStack_28;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)columnLength,
             (value_type_conflict1 *)((long)&uStack_28 + 4),(allocator_type *)((long)&uStack_28 + 3)
            );
  p_Var4 = (this->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  puVar2 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(this->column_)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    uVar1 = *(uint *)(*(long *)(p_Var4 + 1) + 8);
    if ((uint)columnLength <= uVar1) break;
    puVar2[uVar1] = *(uint *)(*(long *)(p_Var4 + 1) + 4);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Set_column<Master_matrix>::Field_element> Set_column<Master_matrix>::get_content(
    int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = (*column_.rbegin())->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}